

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  anon_class_1_0_00000001 local_191;
  Callback local_190;
  allocator<char> local_169;
  string local_168;
  anon_class_1_0_00000001 local_141;
  NullCallback local_140;
  anon_class_1_0_00000001 local_119;
  Callback local_118;
  anon_class_1_0_00000001 local_f1;
  Callback local_f0;
  anon_class_1_0_00000001 local_c9;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  char **argv_local;
  int argc_local;
  
  parser.on_error_._M_invoker = (_Invoker_type)argv;
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_a8,"spectest-interp",
             "  read a Spectest JSON file, and run its tests in the interpreter.\n\nexamples:\n  # parse test.json and run the spec tests\n  $ spectest-interp test.json\n"
            );
  std::function<void()>::function<ParseOptions(int,char**)::__0,void>
            ((function<void()> *)&local_c8,&local_c9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'v',"verbose","Use multiple times for more info",&local_c8);
  std::function<void_()>::~function(&local_c8);
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_a8);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__1,void>
            ((function<void(char_const*)> *)&local_f0,&local_f1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'V',"value-stack-size","SIZE",
             "Size in elements of the value stack",&local_f0);
  std::function<void_(const_char_*)>::~function(&local_f0);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__2,void>
            ((function<void(char_const*)> *)&local_118,&local_119);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'C',"call-stack-size","SIZE",
             "Size in elements of the call stack",&local_118);
  std::function<void_(const_char_*)>::~function(&local_118);
  std::function<void()>::function<ParseOptions(int,char**)::__3,void>
            ((function<void()> *)&local_140,&local_141);
  wabt::OptionParser::AddOption((OptionParser *)local_a8,'t',"trace","Trace execution",&local_140);
  std::function<void_()>::~function(&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"filename",&local_169);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__4,void>
            ((function<void(char_const*)> *)&local_190,&local_191);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,&local_168,One,&local_190);
  std::function<void_(const_char_*)>::~function(&local_190);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  wabt::OptionParser::Parse((OptionParser *)local_a8,argc,(char **)parser.on_error_._M_invoker);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

static void ParseOptions(int argc, char** argv) {
  OptionParser parser("spectest-interp", s_description);

  parser.AddOption('v', "verbose", "Use multiple times for more info", []() {
    s_verbose++;
    s_log_stream = FileStream::CreateStderr();
  });
  s_features.AddOptions(&parser);
  parser.AddOption('V', "value-stack-size", "SIZE",
                   "Size in elements of the value stack",
                   [](const std::string& argument) {
                     // TODO(binji): validate.
                     s_thread_options.value_stack_size = atoi(argument.c_str());
                   });
  parser.AddOption('C', "call-stack-size", "SIZE",
                   "Size in elements of the call stack",
                   [](const std::string& argument) {
                     // TODO(binji): validate.
                     s_thread_options.call_stack_size = atoi(argument.c_str());
                   });
  parser.AddOption('t', "trace", "Trace execution",
                   []() { s_trace_stream = s_stdout_stream.get(); });

  parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                     [](const char* argument) {
                       s_infile = argument;
                       ConvertBackslashToSlash(&s_infile);
                     });
  parser.Parse(argc, argv);
}